

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
resizeImpl<slang::IntervalMapDetails::Path::Entry>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,size_type newSize,
          Entry *val)

{
  Entry *in_RSI;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_RDI;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *unaff_retaddr;
  Entry temp;
  Entry *in_stack_ffffffffffffffc8;
  Entry *in_stack_ffffffffffffffd8;
  __destroy_fn *in_stack_ffffffffffffffe0;
  
  if (in_RSI < (Entry *)in_RDI->len) {
    begin(in_RDI);
    end(in_RDI);
    std::ranges::__destroy_fn::
    operator()<slang::IntervalMapDetails::Path::Entry_*,_slang::IntervalMapDetails::Path::Entry_*>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(Entry *)in_RDI);
    in_RDI->len = (size_type)in_RSI;
  }
  else if ((Entry *)in_RDI->len < in_RSI) {
    if ((Entry *)in_RDI->cap < in_RSI) {
      resizeRealloc<slang::IntervalMapDetails::Path::Entry>(unaff_retaddr,(size_type)in_RDI,in_RSI);
    }
    else {
      end(in_RDI);
      std::ranges::__uninitialized_fill_n_fn::
      operator()<slang::IntervalMapDetails::Path::Entry_*,_slang::IntervalMapDetails::Path::Entry>
                ((__uninitialized_fill_n_fn *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                 (iter_difference_t<slang::IntervalMapDetails::Path::Entry_*>)in_RDI,
                 in_stack_ffffffffffffffc8);
      in_RDI->len = (size_type)in_RSI;
    }
  }
  return;
}

Assistant:

void resizeImpl(size_type newSize, const TVal& val) {
        if (newSize < len) {
            std::ranges::destroy(begin() + newSize, end());
            len = newSize;
            return;
        }

        if (newSize > len) {
            if (newSize > cap) {
                // Copy the value in case it's inside our existing array.
                TVal temp(val);
                resizeRealloc(newSize, temp);
                return;
            }

            if constexpr (std::is_same_v<T, TVal>) {
                std::ranges::uninitialized_fill_n(end(), ptrdiff_t(newSize - len), val);
            }
            else if constexpr (std::is_same_v<TVal, DefaultInitTag>) {
                std::ranges::uninitialized_default_construct_n(end(), ptrdiff_t(newSize - len));
            }
            else {
                std::ranges::uninitialized_value_construct_n(end(), ptrdiff_t(newSize - len));
            }
            len = newSize;
        }
    }